

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O0

void write_global(mtree_writer *mtree)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  archive_string *s;
  long in_RDI;
  int effkeys;
  int oldkeys;
  int keys;
  att_counter_set *acs;
  archive_string unsetstr;
  archive_string setstr;
  void *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  uint uVar4;
  archive_string local_20;
  long local_8;
  
  local_20.s = (char *)0x0;
  local_20.length = 0;
  local_20.buffer_length = 0;
  uVar1 = *(uint *)(in_RDI + 0xf0);
  uVar2 = uVar1 & 0x380238;
  uVar4 = *(uint *)(in_RDI + 0x88);
  s = (archive_string *)(in_RDI + 0xb8);
  uVar3 = uVar2;
  if (*(int *)(in_RDI + 0x80) == 0) {
    if (s->s == (char *)0x0) {
      uVar3 = uVar1 & 0x80238;
    }
    if (*(long *)(in_RDI + 0xc0) == 0) {
      uVar3 = uVar3 & 0xffffffcf;
    }
    if (*(long *)(in_RDI + 200) == 0) {
      uVar3 = uVar3 & 0xfffffdff;
    }
    if (*(long *)(in_RDI + 0xd0) == 0) {
      uVar3 = uVar3 & 0xfffffff7;
    }
  }
  else {
    uVar2 = uVar1 & 0x300238;
    if (s->s == (char *)0x0) {
      uVar2 = uVar1 & 0x238;
    }
    else if (((uVar4 & 0x300000) != 0) &&
            ((*(int *)(s->s + 0x18) < 2 ||
             (*(long *)(in_RDI + 0x90) == *(long *)(*(long *)(s->s + 0x10) + 0xf8))))) {
      uVar2 = uVar1 & 0x238;
    }
    if (*(long *)(in_RDI + 0xc0) == 0) {
      uVar2 = uVar2 & 0xffffffcf;
    }
    else if (((uVar4 & 0x30) != 0) &&
            ((*(int *)(*(long *)(in_RDI + 0xc0) + 0x18) < 2 ||
             (*(long *)(in_RDI + 0x98) ==
              *(long *)(*(long *)(*(long *)(in_RDI + 0xc0) + 0x10) + 0x100))))) {
      uVar2 = uVar2 & 0xffffffcf;
    }
    if (*(long *)(in_RDI + 200) == 0) {
      uVar2 = uVar2 & 0xfffffdff;
    }
    else if (((uVar4 & 0x200) != 0) &&
            ((*(int *)(*(long *)(in_RDI + 200) + 0x18) < 2 ||
             (*(int *)(in_RDI + 0xa0) == *(int *)(*(long *)(*(long *)(in_RDI + 200) + 0x10) + 0xe8))
             ))) {
      uVar2 = uVar2 & 0xfffffdff;
    }
    if (*(long *)(in_RDI + 0xd0) == 0) {
      uVar2 = uVar2 & 0xfffffff7;
    }
    else if (((uVar4 & 8) != 0) &&
            ((*(int *)(*(long *)(in_RDI + 0xd0) + 0x18) < 2 ||
             ((*(long *)(*(long *)(*(long *)(in_RDI + 0xd0) + 0x10) + 0x118) ==
               *(long *)(in_RDI + 0xa8) &&
              (*(long *)(*(long *)(*(long *)(in_RDI + 0xd0) + 0x10) + 0x120) ==
               *(long *)(in_RDI + 0xb0))))))) {
      uVar2 = uVar2 & 0xfffffff7;
    }
  }
  local_8 = in_RDI;
  if ((uVar3 & uVar2 & 0x80000) != 0) {
    if (*(int *)(in_RDI + 0xf4) == 0) {
      archive_strcat((archive_string *)CONCAT44(uVar2,in_stack_ffffffffffffffb0),
                     in_stack_ffffffffffffffa8);
      *(undefined4 *)(local_8 + 0x84) = 0x8000;
    }
    else {
      archive_strcat((archive_string *)CONCAT44(uVar2,in_stack_ffffffffffffffb0),
                     in_stack_ffffffffffffffa8);
      *(undefined4 *)(local_8 + 0x84) = 0x4000;
    }
  }
  if ((uVar3 & uVar2 & 0x200000) != 0) {
    if (*(long *)(*(long *)(s->s + 0x10) + 0xa0) == 0) {
      uVar3 = uVar3 & 0xffdfffff;
      if ((uVar4 & 0x200000) != 0) {
        archive_strcat((archive_string *)CONCAT44(uVar2,in_stack_ffffffffffffffb0),
                       in_stack_ffffffffffffffa8);
      }
    }
    else {
      archive_strcat((archive_string *)CONCAT44(uVar2,in_stack_ffffffffffffffb0),
                     in_stack_ffffffffffffffa8);
      mtree_quote(s,(char *)CONCAT44(uVar3,uVar4));
    }
  }
  if ((uVar3 & uVar2 & 0x100000) != 0) {
    *(undefined8 *)(local_8 + 0x90) = *(undefined8 *)(*(long *)(s->s + 0x10) + 0xf8);
    archive_string_sprintf(&local_20," uid=%jd",*(undefined8 *)(local_8 + 0x90));
  }
  if ((uVar3 & uVar2 & 0x20) != 0) {
    if (*(long *)(*(long *)(s->length + 0x10) + 0xb8) == 0) {
      uVar3 = uVar3 & 0xffffffdf;
      if ((uVar4 & 0x20) != 0) {
        archive_strcat((archive_string *)CONCAT44(uVar2,in_stack_ffffffffffffffb0),
                       in_stack_ffffffffffffffa8);
      }
    }
    else {
      archive_strcat((archive_string *)CONCAT44(uVar2,in_stack_ffffffffffffffb0),
                     in_stack_ffffffffffffffa8);
      mtree_quote(s,(char *)CONCAT44(uVar3,uVar4));
    }
  }
  if ((uVar3 & uVar2 & 0x10) != 0) {
    *(undefined8 *)(local_8 + 0x98) = *(undefined8 *)(*(long *)(s->length + 0x10) + 0x100);
    archive_string_sprintf(&local_20," gid=%jd",*(undefined8 *)(local_8 + 0x98));
  }
  if ((uVar3 & uVar2 & 0x200) != 0) {
    *(undefined4 *)(local_8 + 0xa0) = *(undefined4 *)(*(long *)(s->buffer_length + 0x10) + 0xe8);
    archive_string_sprintf(&local_20," mode=%o",(ulong)*(uint *)(local_8 + 0xa0));
  }
  if ((uVar3 & uVar2 & 8) != 0) {
    if (*(long *)(*(long *)(s[1].s + 0x10) + 0xd0) == 0) {
      uVar3 = uVar3 & 0xfffffff7;
      if ((uVar4 & 8) != 0) {
        archive_strcat((archive_string *)CONCAT44(uVar2,in_stack_ffffffffffffffb0),
                       in_stack_ffffffffffffffa8);
      }
    }
    else {
      archive_strcat((archive_string *)CONCAT44(uVar2,in_stack_ffffffffffffffb0),
                     in_stack_ffffffffffffffa8);
      mtree_quote(s,(char *)CONCAT44(uVar3,uVar4));
      *(undefined8 *)(local_8 + 0xa8) = *(undefined8 *)(*(long *)(s[1].s + 0x10) + 0x118);
      *(undefined8 *)(local_8 + 0xb0) = *(undefined8 *)(*(long *)(s[1].s + 0x10) + 0x120);
    }
  }
  archive_string_free((archive_string *)0x1a036e);
  if (local_20.length != 0) {
    archive_string_sprintf((archive_string *)(local_8 + 0x58),"/set%s\n",local_20.s);
  }
  archive_string_free((archive_string *)0x1a039c);
  *(uint *)(local_8 + 0x88) = uVar3;
  *(undefined4 *)(local_8 + 0x80) = 1;
  return;
}

Assistant:

static void
write_global(struct mtree_writer *mtree)
{
	struct archive_string setstr;
	struct archive_string unsetstr;
	struct att_counter_set *acs;
	int keys, oldkeys, effkeys;

	archive_string_init(&setstr);
	archive_string_init(&unsetstr);
	keys = mtree->keys & SET_KEYS;
	oldkeys = mtree->set.keys;
	effkeys = keys;
	acs = &mtree->acs;
	if (mtree->set.processing) {
		/*
		 * Check if the global data needs updating.
		 */
		effkeys &= ~F_TYPE;
		if (acs->uid_list == NULL)
			effkeys &= ~(F_UNAME | F_UID);
		else if (oldkeys & (F_UNAME | F_UID)) {
			if (acs->uid_list->count < 2 ||
			    mtree->set.uid == acs->uid_list->m_entry->uid)
				effkeys &= ~(F_UNAME | F_UID);
		}
		if (acs->gid_list == NULL)
			effkeys &= ~(F_GNAME | F_GID);
		else if (oldkeys & (F_GNAME | F_GID)) {
			if (acs->gid_list->count < 2 ||
			    mtree->set.gid == acs->gid_list->m_entry->gid)
				effkeys &= ~(F_GNAME | F_GID);
		}
		if (acs->mode_list == NULL)
			effkeys &= ~F_MODE;
		else if (oldkeys & F_MODE) {
			if (acs->mode_list->count < 2 ||
			    mtree->set.mode == acs->mode_list->m_entry->mode)
				effkeys &= ~F_MODE;
		}
		if (acs->flags_list == NULL)
			effkeys &= ~F_FLAGS;
		else if ((oldkeys & F_FLAGS) != 0) {
			if (acs->flags_list->count < 2 ||
			    (acs->flags_list->m_entry->fflags_set ==
				mtree->set.fflags_set &&
			     acs->flags_list->m_entry->fflags_clear ==
				mtree->set.fflags_clear))
				effkeys &= ~F_FLAGS;
		}
	} else {
		if (acs->uid_list == NULL)
			keys &= ~(F_UNAME | F_UID);
		if (acs->gid_list == NULL)
			keys &= ~(F_GNAME | F_GID);
		if (acs->mode_list == NULL)
			keys &= ~F_MODE;
		if (acs->flags_list == NULL)
			keys &= ~F_FLAGS;
	}
	if ((keys & effkeys & F_TYPE) != 0) {
		if (mtree->dironly) {
			archive_strcat(&setstr, " type=dir");
			mtree->set.type = AE_IFDIR;
		} else {
			archive_strcat(&setstr, " type=file");
			mtree->set.type = AE_IFREG;
		}
	}
	if ((keys & effkeys & F_UNAME) != 0) {
		if (archive_strlen(&(acs->uid_list->m_entry->uname)) > 0) {
			archive_strcat(&setstr, " uname=");
			mtree_quote(&setstr, acs->uid_list->m_entry->uname.s);
		} else {
			keys &= ~F_UNAME;
			if ((oldkeys & F_UNAME) != 0)
				archive_strcat(&unsetstr, " uname");
		}
	}
	if ((keys & effkeys & F_UID) != 0) {
		mtree->set.uid = acs->uid_list->m_entry->uid;
		archive_string_sprintf(&setstr, " uid=%jd",
		    (intmax_t)mtree->set.uid);
	}
	if ((keys & effkeys & F_GNAME) != 0) {
		if (archive_strlen(&(acs->gid_list->m_entry->gname)) > 0) {
			archive_strcat(&setstr, " gname=");
			mtree_quote(&setstr, acs->gid_list->m_entry->gname.s);
		} else {
			keys &= ~F_GNAME;
			if ((oldkeys & F_GNAME) != 0)
				archive_strcat(&unsetstr, " gname");
		}
	}
	if ((keys & effkeys & F_GID) != 0) {
		mtree->set.gid = acs->gid_list->m_entry->gid;
		archive_string_sprintf(&setstr, " gid=%jd",
		    (intmax_t)mtree->set.gid);
	}
	if ((keys & effkeys & F_MODE) != 0) {
		mtree->set.mode = acs->mode_list->m_entry->mode;
		archive_string_sprintf(&setstr, " mode=%o",
		    (unsigned int)mtree->set.mode);
	}
	if ((keys & effkeys & F_FLAGS) != 0) {
		if (archive_strlen(
		    &(acs->flags_list->m_entry->fflags_text)) > 0) {
			archive_strcat(&setstr, " flags=");
			mtree_quote(&setstr,
			    acs->flags_list->m_entry->fflags_text.s);
			mtree->set.fflags_set =
			    acs->flags_list->m_entry->fflags_set;
			mtree->set.fflags_clear =
			    acs->flags_list->m_entry->fflags_clear;
		} else {
			keys &= ~F_FLAGS;
			if ((oldkeys & F_FLAGS) != 0)
				archive_strcat(&unsetstr, " flags");
		}
	}
	if (unsetstr.length > 0)
		archive_string_sprintf(&mtree->buf, "/unset%s\n", unsetstr.s);
	archive_string_free(&unsetstr);
	if (setstr.length > 0)
		archive_string_sprintf(&mtree->buf, "/set%s\n", setstr.s);
	archive_string_free(&setstr);
	mtree->set.keys = keys;
	mtree->set.processing = 1;
}